

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

void tt_cmap12_next(TT_CMap12 cmap)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  FT_Byte *pFVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  ulong local_88;
  int local_60;
  
  if (cmap->cur_charcode < 0xffffffff) {
    uVar5 = cmap->cur_group;
    if (uVar5 < cmap->num_groups) {
      pFVar4 = (cmap->cmap).data;
      local_88 = cmap->cur_charcode + 1;
      do {
        bVar2 = pFVar4[uVar5 * 0xc + 0x10];
        lVar17 = (ulong)bVar2 * 0x1000000;
        lVar9 = (ulong)pFVar4[uVar5 * 0xc + 0x11] * 0x10000;
        bVar3 = pFVar4[uVar5 * 0xc + 0x12];
        uVar15 = (ulong)pFVar4[uVar5 * 0xc + 0x13];
        uVar16 = lVar9 + lVar17 | (ulong)bVar3 * 0x100 | uVar15;
        uVar8 = (ulong)pFVar4[uVar5 * 0xc + 0x15] * 0x10000 +
                (ulong)pFVar4[uVar5 * 0xc + 0x14] * 0x1000000 |
                (ulong)pFVar4[uVar5 * 0xc + 0x16] << 8 | (ulong)pFVar4[uVar5 * 0xc + 0x17];
        if (uVar16 < local_88) {
          uVar16 = local_88;
        }
        uVar7 = uVar16;
        if (uVar16 <= uVar8) {
          uVar6 = (uint)pFVar4[uVar5 * 0xc + 0x1a] << 8 |
                  (uint)pFVar4[uVar5 * 0xc + 0x19] << 0x10 |
                  (uint)pFVar4[uVar5 * 0xc + 0x18] << 0x18;
          iVar10 = pFVar4[uVar5 * 0xc + 0x1b] + uVar6;
          uVar7 = (ulong)pFVar4[uVar5 * 0xc + 0x17] +
                  ((ulong)pFVar4[uVar5 * 0xc + 0x14] * 0x1000000 |
                   (ulong)pFVar4[uVar5 * 0xc + 0x15] * 0x10000 |
                  (ulong)pFVar4[uVar5 * 0xc + 0x16] << 8) + 1;
          uVar11 = (uint)pFVar4[uVar5 * 0xc + 0x13];
          uVar18 = (((ulong)bVar3 * 0x100 + lVar9 + lVar17 + uVar15) - uVar16) + 0xffffffff;
          lVar13 = 0;
          do {
            if (uVar18 < ((ulong)pFVar4[uVar5 * 0xc + 0x1b] | (ulong)uVar6)) {
LAB_00165fc8:
              uVar7 = uVar16 + lVar13;
              break;
            }
            iVar12 = (int)lVar13;
            if ((((((int)uVar16 + iVar10) - uVar11) + (uint)bVar3 * -0x100) - (int)lVar9) +
                (uint)bVar2 * -0x1000000 + iVar12 != 0) {
              local_60 = (int)lVar17;
              if (((((((int)uVar16 + iVar10) - uVar11) + (uint)bVar3 * -0x100) - (int)lVar9) -
                  local_60) + iVar12 < (uint)((cmap->cmap).cmap.charmap.face)->num_glyphs) {
                uVar6 = (uint)pFVar4[uVar5 * 0xc + 0x11];
                uVar19 = (uint)bVar2;
                uVar14 = (uint)bVar3;
                uVar16 = (uVar19 * 0x1000000 + uVar6 * 0x10000 | uVar14 * 0x100) | uVar15;
                if (uVar16 < local_88) {
                  uVar16 = local_88;
                }
                cmap->cur_charcode = uVar16 + lVar13;
                uVar15 = (uVar14 << 8 | uVar6 << 0x10 | uVar19 << 0x18) | uVar15;
                if (uVar15 < local_88) {
                  uVar15 = local_88;
                }
                cmap->cur_gindex =
                     iVar12 + ((iVar10 + (int)uVar15) - uVar11) + uVar14 * -0x100 + uVar6 * -0x10000
                              + uVar19 * -0x1000000;
                cmap->cur_group = uVar5;
                return;
              }
              goto LAB_00165fc8;
            }
            if ((uVar16 - 0xffffffff) + lVar13 == 0) goto LAB_00165fde;
            uVar1 = uVar16 + lVar13;
            lVar13 = lVar13 + 1;
            uVar18 = uVar18 - 1;
          } while (uVar1 < uVar8);
        }
        uVar5 = uVar5 + 1;
        local_88 = uVar7;
      } while (uVar5 != cmap->num_groups);
    }
  }
LAB_00165fde:
  cmap->valid = '\0';
  return;
}

Assistant:

static void
  tt_cmap12_next( TT_CMap12  cmap )
  {
    FT_Face   face = cmap->cmap.cmap.charmap.face;
    FT_Byte*  p;
    FT_ULong  start, end, start_id, char_code;
    FT_ULong  n;
    FT_UInt   gindex;


    if ( cmap->cur_charcode >= 0xFFFFFFFFUL )
      goto Fail;

    char_code = cmap->cur_charcode + 1;

    for ( n = cmap->cur_group; n < cmap->num_groups; n++ )
    {
      p        = cmap->cmap.data + 16 + 12 * n;
      start    = TT_NEXT_ULONG( p );
      end      = TT_NEXT_ULONG( p );
      start_id = TT_PEEK_ULONG( p );

      if ( char_code < start )
        char_code = start;

    Again:
      if ( char_code <= end )
      {
        /* ignore invalid group */
        if ( start_id > 0xFFFFFFFFUL - ( char_code - start ) )
          continue;

        gindex = (FT_UInt)( start_id + ( char_code - start ) );

        /* does first element of group point to `.notdef' glyph? */
        if ( gindex == 0 )
        {
          if ( char_code >= 0xFFFFFFFFUL )
            goto Fail;

          char_code++;
          goto Again;
        }

        /* if `gindex' is invalid, the remaining values */
        /* in this group are invalid, too               */
        if ( gindex >= (FT_UInt)face->num_glyphs )
        {
          gindex = 0;
          continue;
        }

        cmap->cur_charcode = char_code;
        cmap->cur_gindex   = gindex;
        cmap->cur_group    = n;

        return;
      }
    }

  Fail:
    cmap->valid = 0;
  }